

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O1

void __thiscall LogOutput::add(LogOutput *this)

{
  int iVar1;
  shared_ptr<LogOutput> sStack_18;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&sOutputsMutex);
  if (iVar1 == 0) {
    std::__shared_ptr<LogOutput,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<LogOutput,void>
              ((__shared_ptr<LogOutput,(__gnu_cxx::_Lock_policy)2> *)&sStack_18,
               (__weak_ptr<LogOutput,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<LogOutput>);
    std::
    _Rb_tree<std::shared_ptr<LogOutput>,std::shared_ptr<LogOutput>,std::_Identity<std::shared_ptr<LogOutput>>,std::less<std::shared_ptr<LogOutput>>,std::allocator<std::shared_ptr<LogOutput>>>
    ::_M_insert_unique<std::shared_ptr<LogOutput>const&>
              ((_Rb_tree<std::shared_ptr<LogOutput>,std::shared_ptr<LogOutput>,std::_Identity<std::shared_ptr<LogOutput>>,std::less<std::shared_ptr<LogOutput>>,std::allocator<std::shared_ptr<LogOutput>>>
                *)&sOutputs,&sStack_18);
    if (sStack_18.super___shared_ptr<LogOutput,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (sStack_18.super___shared_ptr<LogOutput,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&sOutputsMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void LogOutput::add()
{
    std::lock_guard<std::mutex> lock(sOutputsMutex);
    sOutputs.insert(shared_from_this());
}